

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffffrw_work(long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
               void *userPtr)

{
  ParseData *pPVar1;
  Node *pNVar2;
  long in_RCX;
  long in_RDX;
  undefined4 in_R8D;
  long in_R9;
  ParseData *lParse;
  ffffrw_workdata *workData;
  Node *result;
  long idx;
  long in_stack_ffffffffffffffc0;
  long lVar3;
  undefined4 in_stack_ffffffffffffffd0;
  
  pPVar1 = workData->lParse;
  Evaluate_Parser((ParseData *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_R9,
                  in_stack_ffffffffffffffc0);
  if (pPVar1->status == 0) {
    pNVar2 = pPVar1->Nodes + pPVar1->resultNode;
    if (pNVar2->operation == -1000) {
      if ((pNVar2->value).data.log != '\0') {
        *workData->prownum = in_RDX;
        return -1;
      }
    }
    else {
      for (lVar3 = 0; lVar3 < in_RCX; lVar3 = lVar3 + 1) {
        if ((*(char *)((long)(pNVar2->value).data.dblptr + lVar3) != '\0') &&
           ((pNVar2->value).undef[lVar3] == '\0')) {
          *workData->prownum = in_RDX + lVar3;
          return -1;
        }
      }
    }
  }
  return pPVar1->status;
}

Assistant:

int ffffrw_work(long        totalrows, /* I - Total rows to be processed     */
                long        offset,    /* I - Number of rows skipped at start*/
                long        firstrow,  /* I - First row of this iteration    */
                long        nrows,     /* I - Number of rows in this iter    */
                int         nCols,     /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void        *userPtr ) /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and searches for the        */
/* first row which evaluates to TRUE.                                        */
/*---------------------------------------------------------------------------*/
{
    long idx;
    Node *result;
    ffffrw_workdata *workData = userPtr;
    ParseData *lParse = workData->lParse;

    Evaluate_Parser( lParse, firstrow, nrows );

    if( !lParse->status ) {

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) {

          if( result->value.data.log ) {
	     *(workData->prownum) = firstrow;
             return( -1 );
          }

       } else {

          for( idx=0; idx<nrows; idx++ )
             if( result->value.data.logptr[idx] && !result->value.undef[idx] ) {
	        *(workData->prownum) = firstrow + idx;;
                return( -1 );
             }
       }
    }

    return( lParse->status );
}